

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::RoundScalarWithFormatT<float,float>(char *format,ImGuiDataType data_type,float v)

{
  char cVar1;
  char cVar2;
  long lVar3;
  char *__nptr;
  char *pcVar4;
  float fVar5;
  double dVar6;
  char v_str [64];
  char local_58 [72];
  
  cVar1 = *format;
  if (cVar1 != '\0') {
    do {
      if ((cVar1 == '%') && (format[1] != '%')) {
        ImFormatString(local_58,0x40,format,(double)v);
        pcVar4 = local_58;
        do {
          __nptr = pcVar4;
          cVar1 = *__nptr;
          pcVar4 = __nptr + 1;
        } while (cVar1 == ' ');
        if ((data_type & 0xfffffffeU) == 8) {
          dVar6 = atof(__nptr);
          return (float)dVar6;
        }
        lVar3 = (ulong)(__nptr[cVar1 == '-'] == '+') + (ulong)(cVar1 == '-');
        cVar2 = __nptr[lVar3];
        fVar5 = 0.0;
        if ((byte)(cVar2 - 0x30U) < 10) {
          pcVar4 = __nptr + 1 + lVar3;
          do {
            fVar5 = fVar5 * 10.0 + (float)(int)(char)(cVar2 + -0x30);
            cVar2 = *pcVar4;
            pcVar4 = pcVar4 + 1;
          } while ((byte)(cVar2 - 0x30U) < 10);
        }
        if (cVar1 != '-') {
          return fVar5;
        }
        return -fVar5;
      }
      format = format + (ulong)(cVar1 == '%') + 1;
      cVar1 = *format;
    } while (cVar1 != '\0');
  }
  return v;
}

Assistant:

const char* ImParseFormatFindStart(const char* fmt)
{
    while (char c = fmt[0])
    {
        if (c == '%' && fmt[1] != '%')
            return fmt;
        else if (c == '%')
            fmt++;
        fmt++;
    }
    return fmt;
}